

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_c_sol.c
# Opt level: O0

void OnIntSuffix(void *p_user_data,NLW2_SuffixInfo_C si,void *p_api_data)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int *in_RDI;
  int v;
  int i;
  char *table;
  char *name;
  int nmax;
  int kind;
  int nitems_max [4];
  CAPIExample *pex;
  uint local_48;
  uint local_44;
  int *pi;
  uint uVar4;
  int local_28 [10];
  
  local_28[0] = *in_RDI;
  local_28[1] = in_RDI[2];
  local_28[2] = in_RDI[3];
  local_28[3] = 1;
  iVar2 = local_28[(int)((uint)table & 3)];
  pi = (int *)name;
  uVar4 = (uint)table;
  printf("SUFFIX \'%s\': kind=%d\n",name,(ulong)(uint)table);
  if ((_nmax != (int *)0x0) && (sVar3 = strlen((char *)_nmax), sVar3 != 0)) {
    printf("SUFFIX TABLE:\n%s\n",_nmax);
  }
  printf("%s","NON-ZERO VALUES:");
  do {
    iVar1 = NLW2_IntSuffixNNZ((void *)0x1068c3);
    if (iVar1 == 0) {
      iVar2 = NLW2_IntSuffixReadOK((void *)0x10691f);
      if (iVar2 != 0) {
        printf(" ...%s\n","OK");
        return;
      }
      printf(" ...%s\n","FAILURE");
      return;
    }
    NLW2_ReadIntSuffixEntry((void *)CONCAT44(uVar4,iVar2),pi,_nmax);
    printf(" (%d, %d)",(ulong)local_44,(ulong)local_48);
  } while ((-1 < (int)local_44) && ((int)local_44 < iVar2));
  NLW2_ReportIntSuffixError(name,(char *)CONCAT44(table._4_4_,(uint)table));
  return;
}

Assistant:

void OnIntSuffix(
    void* p_user_data, NLW2_SuffixInfo_C si, void* p_api_data) {
  CAPIExample* pex = (CAPIExample*)p_user_data;
  int nitems_max[4] = {pex->n_var, pex->n_con, pex->n_obj, 1};
  int kind = si.kind_;
  int nmax = nitems_max[kind & 3];  // {vars, cons, objs, 1}
  const char* name = si.name_;
  const char* table = si.table_;
  printf("SUFFIX '%s': kind=%d\n", name, kind);
  if (table && strlen(table))
    printf("SUFFIX TABLE:\n%s\n", table);
  int i;
  int v;
  printf("%s", "NON-ZERO VALUES:");
  while (NLW2_IntSuffixNNZ(p_api_data)) {
    NLW2_ReadIntSuffixEntry(p_api_data, &i, &v);
    printf(" (%d, %d)", i, v);
    if (i<0 || i>=nmax) {
      NLW2_ReportIntSuffixError(
            p_api_data, "bad suffix element index");
      return;
    }
  }
  if (NLW2_IntSuffixReadOK(p_api_data))    // Can check
    printf(" ...%s\n", "OK");
  else
    printf(" ...%s\n", "FAILURE");
}